

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_registrymanager.c
# Opt level: O0

IOTHUB_REGISTRYMANAGER_RESULT
parseDeviceOrModuleJsonObject(JSON_Object *root_object,IOTHUB_DEVICE_OR_MODULE *deviceOrModuleInfo)

{
  int iVar1;
  int iVar2;
  char *source;
  char *source_00;
  char *source_01;
  char *__s1;
  char *source_02;
  char *source_03;
  char *__s1_00;
  char *source_04;
  char *__s1_01;
  char *source_05;
  char *source_06;
  char *source_07;
  char *__nptr;
  char *__s1_02;
  char *source_08;
  char *source_09;
  char *source_10;
  LOGGER_LOG p_Var3;
  LOGGER_LOG l_13;
  LOGGER_LOG l_12;
  LOGGER_LOG l_11;
  LOGGER_LOG l_10;
  LOGGER_LOG l_9;
  LOGGER_LOG l_8;
  LOGGER_LOG l_7;
  LOGGER_LOG l_6;
  LOGGER_LOG l_5;
  LOGGER_LOG l_4;
  LOGGER_LOG l_3;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  int iotEdge_capable;
  char *serviceProperties;
  char *deviceProperties;
  char *configuration;
  char *isManaged;
  char *cloudToDeviceMessageCount;
  char *lastActivityTime;
  char *statusUpdatedTime;
  char *statusReason;
  char *status;
  char *connectionStateUpdatedTime;
  char *connectionState;
  char *eTag;
  char *generationId;
  char *authType;
  char *secondaryKey;
  char *primaryKey;
  char *managedBy;
  char *moduleId;
  char *deviceId;
  IOTHUB_REGISTRYMANAGER_RESULT result;
  IOTHUB_DEVICE_OR_MODULE *deviceOrModuleInfo_local;
  JSON_Object *root_object_local;
  
  source = json_object_get_string(root_object,DEVICE_JSON_KEY_DEVICE_NAME);
  source_00 = json_object_get_string(root_object,DEVICE_JSON_KEY_MODULE_NAME);
  source_01 = json_object_get_string(root_object,DEVICE_JSON_KEY_MANAGED_BY);
  secondaryKey = (char *)0x0;
  authType = (char *)0x0;
  __s1 = json_object_dotget_string(root_object,DEVICE_JSON_KEY_DEVICE_AUTH_TYPE);
  source_02 = json_object_get_string(root_object,DEVICE_JSON_KEY_DEVICE_GENERATION_ID);
  source_03 = json_object_get_string(root_object,DEVICE_JSON_KEY_DEVICE_ETAG);
  __s1_00 = json_object_get_string(root_object,DEVICE_JSON_KEY_DEVICE_CONNECTIONSTATE);
  source_04 = json_object_get_string(root_object,DEVICE_JSON_KEY_DEVICE_CONNECTIONSTATEUPDATEDTIME);
  __s1_01 = json_object_get_string(root_object,DEVICE_JSON_KEY_DEVICE_STATUS);
  source_05 = json_object_get_string(root_object,DEVICE_JSON_KEY_DEVICE_STATUSREASON);
  source_06 = json_object_get_string(root_object,DEVICE_JSON_KEY_DEVICE_STATUSUPDATEDTIME);
  source_07 = json_object_get_string(root_object,DEVICE_JSON_KEY_DEVICE_LASTACTIVITYTIME);
  __nptr = json_object_get_string(root_object,DEVICE_JSON_KEY_DEVICE_CLOUDTODEVICEMESSAGECOUNT);
  __s1_02 = json_object_get_string(root_object,DEVICE_JSON_KEY_DEVICE_ISMANAGED);
  source_08 = json_object_get_string(root_object,DEVICE_JSON_KEY_DEVICE_CONFIGURATION);
  source_09 = json_object_get_string(root_object,DEVICE_JSON_KEY_DEVICE_DEVICEROPERTIES);
  source_10 = json_object_get_string(root_object,DEVICE_JSON_KEY_DEVICE_SERVICEPROPERTIES);
  iVar1 = json_object_dotget_boolean(root_object,DEVICE_JSON_KEY_CAPABILITIES_IOTEDGE);
  if (__s1 == (char *)0x0) {
    deviceOrModuleInfo->authMethod = IOTHUB_REGISTRYMANAGER_AUTH_UNKNOWN;
  }
  else {
    iVar2 = strcmp(__s1,DEVICE_JSON_KEY_DEVICE_AUTH_SAS);
    if (iVar2 == 0) {
      secondaryKey = json_object_dotget_string(root_object,DEVICE_JSON_KEY_DEVICE_PRIMARY_KEY);
      authType = json_object_dotget_string(root_object,DEVICE_JSON_KEY_DEVICE_SECONDARY_KEY);
      deviceOrModuleInfo->authMethod = IOTHUB_REGISTRYMANAGER_AUTH_SPK;
    }
    else {
      iVar2 = strcmp(__s1,DEVICE_JSON_KEY_DEVICE_AUTH_SELF_SIGNED);
      if (iVar2 == 0) {
        secondaryKey = json_object_dotget_string
                                 (root_object,DEVICE_JSON_KEY_DEVICE_PRIMARY_THUMBPRINT);
        authType = json_object_dotget_string
                             (root_object,DEVICE_JSON_KEY_DEVICE_SECONDARY_THUMBPRINT);
        deviceOrModuleInfo->authMethod = IOTHUB_REGISTRYMANAGER_AUTH_X509_THUMBPRINT;
      }
      else {
        iVar2 = strcmp(__s1,DEVICE_JSON_KEY_DEVICE_AUTH_CERTIFICATE_AUTHORITY);
        if (iVar2 == 0) {
          deviceOrModuleInfo->authMethod = IOTHUB_REGISTRYMANAGER_AUTH_X509_CERTIFICATE_AUTHORITY;
        }
        else {
          iVar2 = strcmp(__s1,DEVICE_JSON_KEY_DEVICE_AUTH_NONE);
          if (iVar2 == 0) {
            deviceOrModuleInfo->authMethod = IOTHUB_REGISTRYMANAGER_AUTH_NONE;
          }
          else {
            deviceOrModuleInfo->authMethod = IOTHUB_REGISTRYMANAGER_AUTH_UNKNOWN;
          }
        }
      }
    }
  }
  if ((source == (char *)0x0) ||
     (iVar2 = mallocAndStrcpy_s(&deviceOrModuleInfo->deviceId,source), iVar2 == 0)) {
    if ((source_00 == (char *)0x0) ||
       (iVar2 = mallocAndStrcpy_s(&deviceOrModuleInfo->moduleId,source_00), iVar2 == 0)) {
      if ((secondaryKey == (char *)0x0) ||
         (iVar2 = mallocAndStrcpy_s(&deviceOrModuleInfo->primaryKey,secondaryKey), iVar2 == 0)) {
        if ((authType == (char *)0x0) ||
           (iVar2 = mallocAndStrcpy_s(&deviceOrModuleInfo->secondaryKey,authType), iVar2 == 0)) {
          if ((source_02 == (char *)0x0) ||
             (iVar2 = mallocAndStrcpy_s(&deviceOrModuleInfo->generationId,source_02), iVar2 == 0)) {
            if ((source_03 == (char *)0x0) ||
               (iVar2 = mallocAndStrcpy_s(&deviceOrModuleInfo->eTag,source_03), iVar2 == 0)) {
              if ((source_04 == (char *)0x0) ||
                 (iVar2 = mallocAndStrcpy_s(&deviceOrModuleInfo->connectionStateUpdatedTime,
                                            source_04), iVar2 == 0)) {
                if ((source_05 == (char *)0x0) ||
                   (iVar2 = mallocAndStrcpy_s(&deviceOrModuleInfo->statusReason,source_05),
                   iVar2 == 0)) {
                  if ((source_06 == (char *)0x0) ||
                     (iVar2 = mallocAndStrcpy_s(&deviceOrModuleInfo->statusUpdatedTime,source_06),
                     iVar2 == 0)) {
                    if ((source_07 == (char *)0x0) ||
                       (iVar2 = mallocAndStrcpy_s(&deviceOrModuleInfo->lastActivityTime,source_07),
                       iVar2 == 0)) {
                      if ((source_08 == (char *)0x0) ||
                         (iVar2 = mallocAndStrcpy_s(&deviceOrModuleInfo->configuration,source_08),
                         iVar2 == 0)) {
                        if ((source_09 == (char *)0x0) ||
                           (iVar2 = mallocAndStrcpy_s(&deviceOrModuleInfo->deviceProperties,
                                                      source_09), iVar2 == 0)) {
                          if ((source_10 == (char *)0x0) ||
                             (iVar2 = mallocAndStrcpy_s(&deviceOrModuleInfo->serviceProperties,
                                                        source_10), iVar2 == 0)) {
                            if ((source_01 == (char *)0x0) ||
                               (iVar2 = mallocAndStrcpy_s(&deviceOrModuleInfo->managedBy,source_01),
                               iVar2 == 0)) {
                              if ((__s1_00 != (char *)0x0) &&
                                 (iVar2 = strcmp(__s1_00,DEVICE_JSON_DEFAULT_VALUE_CONNECTED),
                                 iVar2 == 0)) {
                                deviceOrModuleInfo->connectionState =
                                     IOTHUB_DEVICE_CONNECTION_STATE_CONNECTED;
                              }
                              if ((__s1_01 != (char *)0x0) &&
                                 (iVar2 = strcmp(__s1_01,DEVICE_JSON_DEFAULT_VALUE_ENABLED),
                                 iVar2 == 0)) {
                                deviceOrModuleInfo->status = IOTHUB_DEVICE_STATUS_ENABLED;
                              }
                              if (__nptr != (char *)0x0) {
                                iVar2 = atoi(__nptr);
                                deviceOrModuleInfo->cloudToDeviceMessageCount = (long)iVar2;
                              }
                              if ((__s1_02 != (char *)0x0) &&
                                 (iVar2 = strcmp(__s1_02,DEVICE_JSON_DEFAULT_VALUE_TRUE), iVar2 == 0
                                 )) {
                                deviceOrModuleInfo->isManaged = true;
                              }
                              if ((iVar1 == -1) || (iVar1 == 0)) {
                                deviceOrModuleInfo->iotEdge_capable = false;
                              }
                              else {
                                deviceOrModuleInfo->iotEdge_capable = true;
                              }
                              deviceId._4_4_ = IOTHUB_REGISTRYMANAGER_OK;
                            }
                            else {
                              p_Var3 = xlogging_get_log_function();
                              if (p_Var3 != (LOGGER_LOG)0x0) {
                                (*p_Var3)(AZ_LOG_ERROR,
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
                                          ,"parseDeviceOrModuleJsonObject",0x2a0,1,
                                          "mallocAndStrcpy_s failed for managedBy");
                              }
                              deviceId._4_4_ = IOTHUB_REGISTRYMANAGER_JSON_ERROR;
                            }
                          }
                          else {
                            p_Var3 = xlogging_get_log_function();
                            if (p_Var3 != (LOGGER_LOG)0x0) {
                              (*p_Var3)(AZ_LOG_ERROR,
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
                                        ,"parseDeviceOrModuleJsonObject",0x29b,1,
                                        "mallocAndStrcpy_s failed for serviceProperties");
                            }
                            deviceId._4_4_ = IOTHUB_REGISTRYMANAGER_JSON_ERROR;
                          }
                        }
                        else {
                          p_Var3 = xlogging_get_log_function();
                          if (p_Var3 != (LOGGER_LOG)0x0) {
                            (*p_Var3)(AZ_LOG_ERROR,
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
                                      ,"parseDeviceOrModuleJsonObject",0x296,1,
                                      "mallocAndStrcpy_s failed for deviceProperties");
                          }
                          deviceId._4_4_ = IOTHUB_REGISTRYMANAGER_JSON_ERROR;
                        }
                      }
                      else {
                        p_Var3 = xlogging_get_log_function();
                        if (p_Var3 != (LOGGER_LOG)0x0) {
                          (*p_Var3)(AZ_LOG_ERROR,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
                                    ,"parseDeviceOrModuleJsonObject",0x291,1,
                                    "mallocAndStrcpy_s failed for configuration");
                        }
                        deviceId._4_4_ = IOTHUB_REGISTRYMANAGER_JSON_ERROR;
                      }
                    }
                    else {
                      p_Var3 = xlogging_get_log_function();
                      if (p_Var3 != (LOGGER_LOG)0x0) {
                        (*p_Var3)(AZ_LOG_ERROR,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
                                  ,"parseDeviceOrModuleJsonObject",0x28c,1,
                                  "mallocAndStrcpy_s failed for lastActivityTime");
                      }
                      deviceId._4_4_ = IOTHUB_REGISTRYMANAGER_JSON_ERROR;
                    }
                  }
                  else {
                    p_Var3 = xlogging_get_log_function();
                    if (p_Var3 != (LOGGER_LOG)0x0) {
                      (*p_Var3)(AZ_LOG_ERROR,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
                                ,"parseDeviceOrModuleJsonObject",0x287,1,
                                "mallocAndStrcpy_s failed for statusUpdatedTime");
                    }
                    deviceId._4_4_ = IOTHUB_REGISTRYMANAGER_JSON_ERROR;
                  }
                }
                else {
                  p_Var3 = xlogging_get_log_function();
                  if (p_Var3 != (LOGGER_LOG)0x0) {
                    (*p_Var3)(AZ_LOG_ERROR,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
                              ,"parseDeviceOrModuleJsonObject",0x282,1,
                              "mallocAndStrcpy_s failed for statusReason");
                  }
                  deviceId._4_4_ = IOTHUB_REGISTRYMANAGER_JSON_ERROR;
                }
              }
              else {
                p_Var3 = xlogging_get_log_function();
                if (p_Var3 != (LOGGER_LOG)0x0) {
                  (*p_Var3)(AZ_LOG_ERROR,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
                            ,"parseDeviceOrModuleJsonObject",0x27d,1,
                            "mallocAndStrcpy_s failed for connectionStateUpdatedTime");
                }
                deviceId._4_4_ = IOTHUB_REGISTRYMANAGER_JSON_ERROR;
              }
            }
            else {
              p_Var3 = xlogging_get_log_function();
              if (p_Var3 != (LOGGER_LOG)0x0) {
                (*p_Var3)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
                          ,"parseDeviceOrModuleJsonObject",0x278,1,
                          "mallocAndStrcpy_s failed for eTag");
              }
              deviceId._4_4_ = IOTHUB_REGISTRYMANAGER_JSON_ERROR;
            }
          }
          else {
            p_Var3 = xlogging_get_log_function();
            if (p_Var3 != (LOGGER_LOG)0x0) {
              (*p_Var3)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
                        ,"parseDeviceOrModuleJsonObject",0x273,1,
                        "mallocAndStrcpy_s failed for generationId");
            }
            deviceId._4_4_ = IOTHUB_REGISTRYMANAGER_JSON_ERROR;
          }
        }
        else {
          p_Var3 = xlogging_get_log_function();
          if (p_Var3 != (LOGGER_LOG)0x0) {
            (*p_Var3)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
                      ,"parseDeviceOrModuleJsonObject",0x26e,1,
                      "mallocAndStrcpy_s failed for secondaryKey");
          }
          deviceId._4_4_ = IOTHUB_REGISTRYMANAGER_JSON_ERROR;
        }
      }
      else {
        p_Var3 = xlogging_get_log_function();
        if (p_Var3 != (LOGGER_LOG)0x0) {
          (*p_Var3)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
                    ,"parseDeviceOrModuleJsonObject",0x269,1,
                    "mallocAndStrcpy_s failed for primaryKey");
        }
        deviceId._4_4_ = IOTHUB_REGISTRYMANAGER_JSON_ERROR;
      }
    }
    else {
      p_Var3 = xlogging_get_log_function();
      if (p_Var3 != (LOGGER_LOG)0x0) {
        (*p_Var3)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
                  ,"parseDeviceOrModuleJsonObject",0x264,1,"mallocAndStrcpy_s failed for moduleId");
      }
      deviceId._4_4_ = IOTHUB_REGISTRYMANAGER_JSON_ERROR;
    }
  }
  else {
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 != (LOGGER_LOG)0x0) {
      (*p_Var3)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
                ,"parseDeviceOrModuleJsonObject",0x25f,1,"mallocAndStrcpy_s failed for deviceId");
    }
    deviceId._4_4_ = IOTHUB_REGISTRYMANAGER_JSON_ERROR;
  }
  return deviceId._4_4_;
}

Assistant:

static IOTHUB_REGISTRYMANAGER_RESULT parseDeviceOrModuleJsonObject(JSON_Object* root_object, IOTHUB_DEVICE_OR_MODULE* deviceOrModuleInfo)
{
    IOTHUB_REGISTRYMANAGER_RESULT result;

    const char* deviceId = json_object_get_string(root_object, DEVICE_JSON_KEY_DEVICE_NAME);
    const char* moduleId = json_object_get_string(root_object, DEVICE_JSON_KEY_MODULE_NAME);
    const char* managedBy = json_object_get_string(root_object, DEVICE_JSON_KEY_MANAGED_BY);
    const char* primaryKey = NULL;
    const char* secondaryKey = NULL;
    const char* authType = json_object_dotget_string(root_object, DEVICE_JSON_KEY_DEVICE_AUTH_TYPE);
    const char* generationId = json_object_get_string(root_object, DEVICE_JSON_KEY_DEVICE_GENERATION_ID);
    const char* eTag = json_object_get_string(root_object, DEVICE_JSON_KEY_DEVICE_ETAG);
    const char* connectionState = json_object_get_string(root_object, DEVICE_JSON_KEY_DEVICE_CONNECTIONSTATE);
    const char* connectionStateUpdatedTime = json_object_get_string(root_object, DEVICE_JSON_KEY_DEVICE_CONNECTIONSTATEUPDATEDTIME);
    const char* status = json_object_get_string(root_object, DEVICE_JSON_KEY_DEVICE_STATUS);
    const char* statusReason = json_object_get_string(root_object, DEVICE_JSON_KEY_DEVICE_STATUSREASON);
    const char* statusUpdatedTime = json_object_get_string(root_object, DEVICE_JSON_KEY_DEVICE_STATUSUPDATEDTIME);
    const char* lastActivityTime = json_object_get_string(root_object, DEVICE_JSON_KEY_DEVICE_LASTACTIVITYTIME);
    const char* cloudToDeviceMessageCount = json_object_get_string(root_object, DEVICE_JSON_KEY_DEVICE_CLOUDTODEVICEMESSAGECOUNT);
    const char* isManaged = json_object_get_string(root_object, DEVICE_JSON_KEY_DEVICE_ISMANAGED);
    const char* configuration = json_object_get_string(root_object, DEVICE_JSON_KEY_DEVICE_CONFIGURATION);
    const char* deviceProperties = json_object_get_string(root_object, DEVICE_JSON_KEY_DEVICE_DEVICEROPERTIES);
    const char* serviceProperties = json_object_get_string(root_object, DEVICE_JSON_KEY_DEVICE_SERVICEPROPERTIES);
    int iotEdge_capable = json_object_dotget_boolean(root_object, DEVICE_JSON_KEY_CAPABILITIES_IOTEDGE);

    if (NULL != authType)
    {
        if (0 == strcmp(authType, DEVICE_JSON_KEY_DEVICE_AUTH_SAS))
        {
            primaryKey = (char*)json_object_dotget_string(root_object, DEVICE_JSON_KEY_DEVICE_PRIMARY_KEY);
            secondaryKey = (char*)json_object_dotget_string(root_object, DEVICE_JSON_KEY_DEVICE_SECONDARY_KEY);
            deviceOrModuleInfo->authMethod = IOTHUB_REGISTRYMANAGER_AUTH_SPK;
        }
        else if (0 == strcmp(authType, DEVICE_JSON_KEY_DEVICE_AUTH_SELF_SIGNED))
        {
            primaryKey = (char*)json_object_dotget_string(root_object, DEVICE_JSON_KEY_DEVICE_PRIMARY_THUMBPRINT);
            secondaryKey = (char*)json_object_dotget_string(root_object, DEVICE_JSON_KEY_DEVICE_SECONDARY_THUMBPRINT);
            deviceOrModuleInfo->authMethod = IOTHUB_REGISTRYMANAGER_AUTH_X509_THUMBPRINT;
        }
        else if (0 == strcmp(authType, DEVICE_JSON_KEY_DEVICE_AUTH_CERTIFICATE_AUTHORITY))
        {
            deviceOrModuleInfo->authMethod = IOTHUB_REGISTRYMANAGER_AUTH_X509_CERTIFICATE_AUTHORITY;
        }
        else if (0 == strcmp(authType, DEVICE_JSON_KEY_DEVICE_AUTH_NONE))
        {
            deviceOrModuleInfo->authMethod = IOTHUB_REGISTRYMANAGER_AUTH_NONE;
        }
        else
        {
            deviceOrModuleInfo->authMethod = IOTHUB_REGISTRYMANAGER_AUTH_UNKNOWN;
        }
    }
    else
    {
        deviceOrModuleInfo->authMethod = IOTHUB_REGISTRYMANAGER_AUTH_UNKNOWN;
    }

    if ((deviceId != NULL) && (mallocAndStrcpy_s((char**)&(deviceOrModuleInfo->deviceId), deviceId) != 0))
    {
        LogError("mallocAndStrcpy_s failed for deviceId");
        result = IOTHUB_REGISTRYMANAGER_JSON_ERROR;
    }
    else if ((moduleId != NULL) && (mallocAndStrcpy_s((char**)&(deviceOrModuleInfo->moduleId), moduleId) != 0))
    {
        LogError("mallocAndStrcpy_s failed for moduleId");
        result = IOTHUB_REGISTRYMANAGER_JSON_ERROR;
    }
    else if ((primaryKey != NULL) && (mallocAndStrcpy_s((char**)&deviceOrModuleInfo->primaryKey, primaryKey) != 0))
    {
        LogError("mallocAndStrcpy_s failed for primaryKey");
        result = IOTHUB_REGISTRYMANAGER_JSON_ERROR;
    }
    else if ((secondaryKey != NULL) && (mallocAndStrcpy_s((char**)&deviceOrModuleInfo->secondaryKey, secondaryKey) != 0))
    {
        LogError("mallocAndStrcpy_s failed for secondaryKey");
        result = IOTHUB_REGISTRYMANAGER_JSON_ERROR;
    }
    else if ((generationId != NULL) && (mallocAndStrcpy_s((char**)&deviceOrModuleInfo->generationId, generationId) != 0))
    {
        LogError("mallocAndStrcpy_s failed for generationId");
        result = IOTHUB_REGISTRYMANAGER_JSON_ERROR;
    }
    else if ((eTag != NULL) && (mallocAndStrcpy_s((char**)&deviceOrModuleInfo->eTag, eTag) != 0))
    {
        LogError("mallocAndStrcpy_s failed for eTag");
        result = IOTHUB_REGISTRYMANAGER_JSON_ERROR;
    }
    else if ((connectionStateUpdatedTime != NULL) && (mallocAndStrcpy_s((char**)&deviceOrModuleInfo->connectionStateUpdatedTime, connectionStateUpdatedTime) != 0))
    {
        LogError("mallocAndStrcpy_s failed for connectionStateUpdatedTime");
        result = IOTHUB_REGISTRYMANAGER_JSON_ERROR;
    }
    else if ((statusReason != NULL) && (mallocAndStrcpy_s((char**)&deviceOrModuleInfo->statusReason, statusReason) != 0))
    {
        LogError("mallocAndStrcpy_s failed for statusReason");
        result = IOTHUB_REGISTRYMANAGER_JSON_ERROR;
    }
    else if ((statusUpdatedTime != NULL) && (mallocAndStrcpy_s((char**)&deviceOrModuleInfo->statusUpdatedTime, statusUpdatedTime) != 0))
    {
        LogError("mallocAndStrcpy_s failed for statusUpdatedTime");
        result = IOTHUB_REGISTRYMANAGER_JSON_ERROR;
    }
    else if ((lastActivityTime != NULL) && (mallocAndStrcpy_s((char**)&deviceOrModuleInfo->lastActivityTime, lastActivityTime) != 0))
    {
        LogError("mallocAndStrcpy_s failed for lastActivityTime");
        result = IOTHUB_REGISTRYMANAGER_JSON_ERROR;
    }
    else if ((configuration != NULL) && (mallocAndStrcpy_s((char**)&deviceOrModuleInfo->configuration, configuration) != 0))
    {
        LogError("mallocAndStrcpy_s failed for configuration");
        result = IOTHUB_REGISTRYMANAGER_JSON_ERROR;
    }
    else if ((deviceProperties != NULL) && (mallocAndStrcpy_s((char**)&deviceOrModuleInfo->deviceProperties, deviceProperties) != 0))
    {
        LogError("mallocAndStrcpy_s failed for deviceProperties");
        result = IOTHUB_REGISTRYMANAGER_JSON_ERROR;
    }
    else if ((serviceProperties != NULL) && (mallocAndStrcpy_s((char**)&deviceOrModuleInfo->serviceProperties, serviceProperties) != 0))
    {
        LogError("mallocAndStrcpy_s failed for serviceProperties");
        result = IOTHUB_REGISTRYMANAGER_JSON_ERROR;
    }
    else if ((managedBy != NULL) && (mallocAndStrcpy_s((char**)&(deviceOrModuleInfo->managedBy), managedBy) != 0))
    {
        LogError("mallocAndStrcpy_s failed for managedBy");
        result = IOTHUB_REGISTRYMANAGER_JSON_ERROR;
    }
    else
    {
        if ((connectionState != NULL) && (strcmp(connectionState, DEVICE_JSON_DEFAULT_VALUE_CONNECTED) == 0))
        {
            deviceOrModuleInfo->connectionState = IOTHUB_DEVICE_CONNECTION_STATE_CONNECTED;
        }
        if ((status != NULL) && (strcmp(status, DEVICE_JSON_DEFAULT_VALUE_ENABLED) == 0))
        {
            deviceOrModuleInfo->status = IOTHUB_DEVICE_STATUS_ENABLED;
        }
        if (cloudToDeviceMessageCount != NULL)
        {
            deviceOrModuleInfo->cloudToDeviceMessageCount = atoi(cloudToDeviceMessageCount);
        }
        if ((isManaged != NULL) && (strcmp(isManaged, DEVICE_JSON_DEFAULT_VALUE_TRUE) == 0))
        {
            deviceOrModuleInfo->isManaged = true;
        }
        if ((iotEdge_capable == -1) || (iotEdge_capable == 0))
        {
            deviceOrModuleInfo->iotEdge_capable = false;
        }
        else
        {
            deviceOrModuleInfo->iotEdge_capable = true;
        }
        result = IOTHUB_REGISTRYMANAGER_OK;
    }

    return result;
}